

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene-access.cc
# Opt level: O0

bool tinyusdz::tydra::ListSceneNames
               (Prim *root,
               vector<std::pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *sceneNames)

{
  bool bVar1;
  bool bVar2;
  PrimMeta *pPVar3;
  value_type *pvVar4;
  vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_> *this;
  reference root_00;
  Prim *child;
  const_iterator __end2;
  const_iterator __begin2;
  vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_> *__range2;
  bool has_sceneLibrary;
  vector<std::pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *sceneNames_local;
  Prim *root_local;
  
  if (sceneNames ==
      (vector<std::pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       *)0x0) {
    root_local._7_1_ = false;
  }
  else {
    bVar2 = false;
    pPVar3 = Prim::metas(root);
    bVar1 = nonstd::optional_lite::optional<tinyusdz::Kind>::has_value(&pPVar3->kind);
    if (bVar1) {
      pPVar3 = Prim::metas(root);
      pvVar4 = nonstd::optional_lite::optional<tinyusdz::Kind>::value(&pPVar3->kind);
      bVar2 = *pvVar4 == SceneLibrary;
    }
    if (bVar2) {
      this = Prim::children(root);
      __end2._M_current =
           (Prim *)std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::begin(this);
      child = (Prim *)std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::end(this);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<const_tinyusdz::Prim_*,_std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>_>
                                         *)&child), bVar2) {
        root_00 = __gnu_cxx::
                  __normal_iterator<const_tinyusdz::Prim_*,_std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>_>
                  ::operator*(&__end2);
        bVar2 = anon_unknown_6::ListSceneNamesRec(root_00,0,sceneNames);
        if (!bVar2) {
          return false;
        }
        __gnu_cxx::
        __normal_iterator<const_tinyusdz::Prim_*,_std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>_>
        ::operator++(&__end2);
      }
      root_local._7_1_ = true;
    }
    else {
      root_local._7_1_ = false;
    }
  }
  return root_local._7_1_;
}

Assistant:

bool ListSceneNames(const tinyusdz::Prim &root,
                    std::vector<std::pair<bool, std::string>> *sceneNames) {
  if (!sceneNames) {
    return false;
  }

  bool has_sceneLibrary = false;
  if (root.metas().kind.has_value()) {
    if (root.metas().kind.value() == Kind::SceneLibrary) {
      // ok
      has_sceneLibrary = true;
    }
  }

  if (!has_sceneLibrary) {
    return false;
  }

  for (const Prim &child : root.children()) {
    if (!ListSceneNamesRec(child, /* depth */ 0, sceneNames)) {
      return false;
    }
  }

  return true;
}